

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.cpp
# Opt level: O0

istream * operator>>(istream *in,Rational *a)

{
  istream *in_RDI;
  string s;
  string *in_stack_000002f8;
  Rational *in_stack_00000300;
  Rational *in_stack_ffffffffffffff68;
  Rational *in_stack_ffffffffffffff70;
  string local_30 [40];
  istream *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::operator>>(local_8,local_30);
  Rational::Rational(in_stack_00000300,in_stack_000002f8);
  Rational::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Rational::~Rational(in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

std::istream &operator>>(std::istream &in, Rational &a)
{
    std::string s;
    in >> s;
    a = Rational(s);
    return in;
}